

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_parser.cpp
# Opt level: O1

MPP_RET mpp_parser_deinit(Parser prs)

{
  MPP_RET MVar1;
  
  if (prs == (Parser)0x0) {
    _mpp_log_l(2,"mpp_dec","found NULL input\n","mpp_parser_deinit");
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    if (*(code **)(*prs + 0x20) != (code *)0x0) {
      (**(code **)(*prs + 0x20))(*(undefined8 *)((long)prs + 8));
    }
    mpp_osal_free("mpp_parser_deinit",*(void **)((long)prs + 8));
    mpp_osal_free("mpp_parser_deinit",prs);
    MVar1 = MPP_OK;
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_parser_deinit(Parser prs)
{
    if (NULL == prs) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    ParserImpl *p = (ParserImpl *)prs;
    if (p->api->deinit)
        p->api->deinit(p->ctx);

    mpp_free(p->ctx);
    mpp_free(p);
    return MPP_OK;
}